

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::
gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
::operator()(gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
             *this,float *blockB,blas_data_mapper<float,_long,_0,_0,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  PacketBlock<__attribute__((__vector_size__(4_*_sizeof(float))))_float,_4> kernel;
  
  if ((depth <= stride) && (offset <= stride)) {
    lVar7 = 4;
    lVar9 = (cols / 4) * 4;
    lVar5 = 8;
    lVar10 = 0xc;
    lVar13 = 0;
    lVar11 = 0;
    for (lVar4 = 0; lVar4 < lVar9; lVar4 = lVar4 + 4) {
      lVar6 = offset * 4 + lVar11;
      pfVar2 = rhs->m_data;
      lVar3 = rhs->m_stride;
      pfVar8 = blockB + offset * 4 + lVar11 + 3;
      lVar11 = lVar11 + stride * 4 + depth * -4;
      for (lVar12 = 0; lVar12 < depth / 4 << 2; lVar12 = lVar12 + 4) {
        pfVar1 = (float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar13);
        kernel.packet[0]._0_8_ = *(undefined8 *)pfVar1;
        kernel.packet[0]._8_8_ = *(undefined8 *)(pfVar1 + 2);
        pfVar1 = (float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar7);
        kernel.packet[1]._0_8_ = *(undefined8 *)pfVar1;
        kernel.packet[1]._8_8_ = *(undefined8 *)(pfVar1 + 2);
        pfVar1 = (float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar5);
        kernel.packet[2]._0_8_ = *(undefined8 *)pfVar1;
        kernel.packet[2]._8_8_ = *(undefined8 *)(pfVar1 + 2);
        pfVar1 = (float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar10);
        kernel.packet[3]._0_8_ = *(undefined8 *)pfVar1;
        kernel.packet[3]._8_8_ = *(undefined8 *)(pfVar1 + 2);
        ptranspose(&kernel);
        *(undefined8 *)(blockB + lVar6) = kernel.packet[0]._0_8_;
        *(undefined8 *)(blockB + lVar6 + 2) = kernel.packet[0]._8_8_;
        *(undefined8 *)(blockB + lVar6 + 4) = kernel.packet[1]._0_8_;
        *(undefined8 *)(blockB + lVar6 + 4 + 2) = kernel.packet[1]._8_8_;
        *(undefined8 *)(blockB + lVar6 + 8) = kernel.packet[2]._0_8_;
        *(undefined8 *)(blockB + lVar6 + 8 + 2) = kernel.packet[2]._8_8_;
        *(undefined8 *)(blockB + lVar6 + 0xc) = kernel.packet[3]._0_8_;
        *(undefined8 *)(blockB + lVar6 + 0xc + 2) = kernel.packet[3]._8_8_;
        lVar6 = lVar6 + 0x10;
        lVar11 = lVar11 + 0x10;
        pfVar8 = pfVar8 + 0x10;
      }
      for (; lVar12 < depth; lVar12 = lVar12 + 1) {
        pfVar8[-3] = *(float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar13);
        pfVar8[-2] = *(float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar7);
        pfVar8[-1] = *(float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar5);
        *pfVar8 = *(float *)((long)pfVar2 + lVar12 * 4 + lVar3 * lVar10);
        lVar11 = lVar11 + 4;
        pfVar8 = pfVar8 + 4;
      }
      lVar13 = lVar13 + 0x10;
      lVar7 = lVar7 + 0x10;
      lVar5 = lVar5 + 0x10;
      lVar10 = lVar10 + 0x10;
    }
    lVar7 = rhs->m_stride;
    lVar5 = depth;
    if (depth < 1) {
      lVar5 = 0;
    }
    pfVar8 = rhs->m_data + (cols / 4) * lVar7 * 4;
    for (; lVar9 < cols; lVar9 = lVar9 + 1) {
      for (lVar10 = 0; lVar5 != lVar10; lVar10 = lVar10 + 1) {
        blockB[offset + lVar11 + lVar10] = pfVar8[lVar10];
      }
      lVar11 = lVar11 + (stride - depth) + lVar10;
      pfVar8 = pfVar8 + lVar7;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x958,
                "void Eigen::internal::gemm_pack_rhs<float, long, Eigen::internal::blas_data_mapper<float, long, 0>, 4, 0, false, true>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = float, Index = long, DataMapper = Eigen::internal::blas_data_mapper<float, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enable vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0           ] = dm0.template loadPacket<Packet>(k);
          kernel.packet[1%PacketSize] = dm1.template loadPacket<Packet>(k);
          kernel.packet[2%PacketSize] = dm2.template loadPacket<Packet>(k);
          kernel.packet[3%PacketSize] = dm3.template loadPacket<Packet>(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}